

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O2

void __thiscall xercesc_4_0::TraverseSchema::traverseInclude(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *pSVar2;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_20;
  
  NamespaceScopeManager::NamespaceScopeManager(&local_20,elem,this->fSchemaInfo,this);
  pSVar2 = RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::get
                     (this->fPreprocessedNodes,elem);
  if (pSVar2 != (SchemaInfo *)0x0) {
    pSVar1 = this->fSchemaInfo;
    this->fSchemaInfo = pSVar2;
    processChildren(this,pSVar2->fSchemaRootElement);
    this->fSchemaInfo = pSVar1;
  }
  NamespaceScopeManager::~NamespaceScopeManager(&local_20);
  return;
}

Assistant:

void TraverseSchema::traverseInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* includeInfo = fPreprocessedNodes->get(elem);

    if (includeInfo) {

        SchemaInfo* saveInfo = fSchemaInfo;

        fSchemaInfo = includeInfo;
        processChildren(includeInfo->getRoot());
        fSchemaInfo = saveInfo;
    }
}